

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiState::HanabiState
          (HanabiState *this,HanabiGame *parent_game,int start_player)

{
  int iVar1;
  int iVar2;
  allocator_type *__a;
  int in_EDX;
  HanabiGame *in_RSI;
  undefined8 *in_RDI;
  HanabiGame *in_stack_ffffffffffffff38;
  allocator_type *in_stack_ffffffffffffff40;
  value_type *__value;
  size_type in_stack_ffffffffffffff48;
  undefined8 *__n;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_84;
  HanabiDeck *in_stack_ffffffffffffffb0;
  undefined1 local_2d [25];
  int local_14;
  HanabiGame *local_10;
  
  *in_RDI = in_RSI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  HanabiDeck::HanabiDeck(in_stack_ffffffffffffffb0,(HanabiGame *)(in_RDI + 1));
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  vector((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
          *)0x15278b);
  HanabiGame::NumPlayers(local_10);
  std::allocator<hanabi_learning_env::HanabiHand>::allocator
            ((allocator<hanabi_learning_env::HanabiHand> *)0x1527d5);
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  vector((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
          *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
         in_stack_ffffffffffffff40);
  std::allocator<hanabi_learning_env::HanabiHand>::~allocator
            ((allocator<hanabi_learning_env::HanabiHand> *)0x1527fb);
  std::
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ::vector((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
            *)0x152811);
  iVar2 = local_14;
  *(undefined4 *)(in_RDI + 0xe) = 0xffffffff;
  if (-1 < local_14) {
    iVar1 = HanabiGame::NumPlayers(local_10);
    if (iVar2 < iVar1) {
      local_84 = local_14;
      goto LAB_00152887;
    }
  }
  local_84 = HanabiGame::GetSampledStartPlayer(in_stack_ffffffffffffff38);
LAB_00152887:
  *(int *)((long)in_RDI + 0x74) = local_84;
  iVar2 = HanabiGame::MaxInformationTokens(local_10);
  *(int *)(in_RDI + 0xf) = iVar2;
  iVar2 = HanabiGame::MaxLifeTokens(local_10);
  *(int *)((long)in_RDI + 0x7c) = iVar2;
  __n = in_RDI + 0x10;
  iVar2 = HanabiGame::NumColors(local_10);
  __a = (allocator_type *)(long)iVar2;
  local_2d._1_4_ = 0;
  __value = (value_type *)local_2d;
  std::allocator<int>::allocator((allocator<int> *)0x15293c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff50),
             (size_type)__n,__value,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x152967);
  iVar2 = HanabiGame::NumPlayers(local_10);
  *(int *)(in_RDI + 0x13) = iVar2;
  return;
}

Assistant:

HanabiState::HanabiState(const HanabiGame* parent_game, int start_player)
    : parent_game_(parent_game),
      deck_(*parent_game),
      hands_(parent_game->NumPlayers()),
      cur_player_(kChancePlayerId),
      next_non_chance_player_(start_player >= 0 &&
                                      start_player < parent_game->NumPlayers()
                                  ? start_player
                                  : parent_game->GetSampledStartPlayer()),
      information_tokens_(parent_game->MaxInformationTokens()),
      life_tokens_(parent_game->MaxLifeTokens()),
      fireworks_(parent_game->NumColors(), 0),
      turns_to_play_(parent_game->NumPlayers()) {}